

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_misc_functions.cc
# Opt level: O0

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
draco::CreateCornerTableFromAllAttributes(Mesh *mesh)

{
  bool bVar1;
  ValueType VVar2;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  *pIVar3;
  const_reference this;
  reference this_00;
  __uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true> in_RDI;
  int j;
  Face *face;
  FaceIndex i;
  FaceType new_face;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  faces;
  Mesh *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  FaceIndex in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa4;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  *in_stack_ffffffffffffffa8;
  ValueType local_4c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_48 [18];
  
  Mesh::num_faces((Mesh *)0x192131);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                     *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::array
            ((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_48,0);
  while( true ) {
    VVar2 = Mesh::num_faces((Mesh *)0x192168);
    local_4c = VVar2;
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_48,&local_4c);
    in_stack_ffffffffffffff80 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff80);
    if (!bVar1) break;
    pIVar3 = (IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
              *)Mesh::face(in_stack_ffffffffffffff68,in_stack_ffffffffffffff74);
    in_stack_ffffffffffffffa8 = pIVar3;
    for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
      this = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
             operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff74.value_,in_stack_ffffffffffffff70),
                        (size_type)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff74.value_ =
           IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(this);
      this_00 = std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::
                operator[]((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>
                            *)CONCAT44(in_stack_ffffffffffffff74.value_,in_stack_ffffffffffffff70),
                           (size_type)in_stack_ffffffffffffff68);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                (this_00,(uint *)&stack0xffffffffffffff9c);
    }
    in_stack_ffffffffffffff68 =
         (Mesh *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                 ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                               *)CONCAT44(in_stack_ffffffffffffff74.value_,in_stack_ffffffffffffff70
                                         ),
                              (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                              in_stack_ffffffffffffff68);
    std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::operator=
              ((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)
               CONCAT44(VVar2,in_stack_ffffffffffffff80),
               (array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)pIVar3);
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_48);
  }
  CornerTable::Create(in_stack_ffffffffffffffa8);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                      *)0x192290);
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
         in_RDI.super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
         _M_t.super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
         .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CornerTable> CreateCornerTableFromAllAttributes(
    const Mesh *mesh) {
  typedef CornerTable::FaceType FaceType;
  IndexTypeVector<FaceIndex, FaceType> faces(mesh->num_faces());
  FaceType new_face;
  for (FaceIndex i(0); i < mesh->num_faces(); ++i) {
    const Mesh::Face &face = mesh->face(i);
    // Each face is identified by point indices that automatically split the
    // mesh along attribute seams.
    for (int j = 0; j < 3; ++j) {
      new_face[j] = face[j].value();
    }
    faces[i] = new_face;
  }
  // Build the corner table.
  return CornerTable::Create(faces);
}